

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O1

void __thiscall
cmCTestCVS::LogParser::LogParser
          (LogParser *this,cmCTestCVS *cvs,char *prefix,
          vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *revs)

{
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',true);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LogParser_006a22b8;
  this->CVS = cvs;
  this->Revisions = revs;
  (this->RegexRevision).regmatch.startp[0] = (char *)0x0;
  (this->RegexRevision).regmatch.endp[0] = (char *)0x0;
  (this->RegexRevision).regmatch.searchstring = (char *)0x0;
  (this->RegexRevision).program = (char *)0x0;
  (this->RegexBranches).regmatch.startp[0] = (char *)0x0;
  (this->RegexBranches).regmatch.endp[0] = (char *)0x0;
  (this->RegexBranches).regmatch.searchstring = (char *)0x0;
  (this->RegexBranches).program = (char *)0x0;
  (this->RegexPerson).regmatch.startp[0] = (char *)0x0;
  (this->RegexPerson).regmatch.endp[0] = (char *)0x0;
  (this->RegexPerson).regmatch.searchstring = (char *)0x0;
  (this->RegexPerson).program = (char *)0x0;
  this->Section = SectionHeader;
  (this->Rev).Rev._M_dataplus._M_p = (pointer)&(this->Rev).Rev.field_2;
  (this->Rev).Rev._M_string_length = 0;
  (this->Rev).Rev.field_2._M_local_buf[0] = '\0';
  (this->Rev).Date._M_dataplus._M_p = (pointer)&(this->Rev).Date.field_2;
  (this->Rev).Date._M_string_length = 0;
  (this->Rev).Date.field_2._M_local_buf[0] = '\0';
  (this->Rev).Author._M_dataplus._M_p = (pointer)&(this->Rev).Author.field_2;
  (this->Rev).Author._M_string_length = 0;
  (this->Rev).Author.field_2._M_local_buf[0] = '\0';
  (this->Rev).EMail._M_dataplus._M_p = (pointer)&(this->Rev).EMail.field_2;
  (this->Rev).EMail._M_string_length = 0;
  (this->Rev).EMail.field_2._M_local_buf[0] = '\0';
  (this->Rev).Committer._M_dataplus._M_p = (pointer)&(this->Rev).Committer.field_2;
  (this->Rev).Committer._M_string_length = 0;
  (this->Rev).Committer.field_2._M_local_buf[0] = '\0';
  (this->Rev).CommitterEMail._M_dataplus._M_p = (pointer)&(this->Rev).CommitterEMail.field_2;
  (this->Rev).CommitterEMail._M_string_length = 0;
  (this->Rev).CommitterEMail.field_2._M_local_buf[0] = '\0';
  (this->Rev).CommitDate._M_dataplus._M_p = (pointer)&(this->Rev).CommitDate.field_2;
  (this->Rev).CommitDate._M_string_length = 0;
  (this->Rev).CommitDate.field_2._M_local_buf[0] = '\0';
  (this->Rev).Log._M_dataplus._M_p = (pointer)&(this->Rev).Log.field_2;
  (this->Rev).Log._M_string_length = 0;
  (this->Rev).Log.field_2._M_local_buf[0] = '\0';
  cmProcessTools::LineParser::SetLog(&this->super_LineParser,(cvs->super_cmCTestVC).Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexRevision,"^revision +([^ ]*) *$");
  cmsys::RegularExpression::compile(&this->RegexBranches,"^branches: .*$");
  cmsys::RegularExpression::compile(&this->RegexPerson,"^date: +([^;]+); +author: +([^;]+);");
  return;
}

Assistant:

LogParser(cmCTestCVS* cvs, const char* prefix, std::vector<Revision>& revs)
    : CVS(cvs)
    , Revisions(revs)
    , Section(SectionHeader)
  {
    this->SetLog(&cvs->Log, prefix);
    this->RegexRevision.compile("^revision +([^ ]*) *$");
    this->RegexBranches.compile("^branches: .*$");
    this->RegexPerson.compile("^date: +([^;]+); +author: +([^;]+);");
  }